

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

int fmt::v7::detail::
    get_dynamic_spec<fmt::v7::detail::width_checker,fmt::v7::basic_format_arg<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>,fmt::v7::detail::error_handler>
              (error_handler *param_1)

{
  int iStack0000000000000008;
  long arg;
  undefined4 in_stack_00000018;
  
  switch(in_stack_00000018) {
  case 1:
    _iStack0000000000000008 = (ulong)iStack0000000000000008;
    break;
  case 2:
    _iStack0000000000000008 = _iStack0000000000000008 & 0xffffffff;
    goto LAB_001a027d;
  case 3:
    break;
  case 4:
  case 6:
    goto switchD_001a0254_caseD_4;
  case 5:
    if (arg < 0) goto LAB_001a026f;
    goto switchD_001a0254_caseD_4;
  default:
    error_handler::on_error(param_1,"width is not integer");
  }
  if ((long)_iStack0000000000000008 < 0) {
LAB_001a026f:
    error_handler::on_error(param_1,"negative width");
  }
LAB_001a027d:
  if (_iStack0000000000000008 >> 0x1f == 0) {
    return (int)_iStack0000000000000008;
  }
  error_handler::on_error(param_1,"number is too big");
switchD_001a0254_caseD_4:
  goto LAB_001a027d;
}

Assistant:

FMT_CONSTEXPR int get_dynamic_spec(FormatArg arg, ErrorHandler eh) {
  unsigned long long value = visit_format_arg(Handler<ErrorHandler>(eh), arg);
  if (value > to_unsigned(max_value<int>())) eh.on_error("number is too big");
  return static_cast<int>(value);
}